

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

CAmount __thiscall CTransaction::GetValueOut(CTransaction *this)

{
  bool bVar1;
  reference pCVar2;
  runtime_error *this_00;
  allocator<char> *in_RDI;
  long in_FS_OFFSET;
  CTxOut *tx_out;
  vector<CTxOut,_std::allocator<CTxOut>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  CAmount nValueOut;
  __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
  *in_stack_ffffffffffffff48;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_stack_ffffffffffffff50;
  __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
  *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  byte local_96;
  char *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  long local_50;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = 0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::begin(in_stack_ffffffffffffff50);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::end(in_stack_ffffffffffffff50);
  do {
    bVar1 = __gnu_cxx::operator==<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                      (in_stack_ffffffffffffff58,
                       (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                        *)in_stack_ffffffffffffff50);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = MoneyRange((CAmount *)in_stack_ffffffffffffff48);
      if (!bVar1) {
        __assert_fail("MoneyRange(nValueOut)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/primitives/transaction.cpp"
                      ,0x6a,"CAmount CTransaction::GetValueOut() const");
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_50;
      }
LAB_010141a4:
      __stack_chk_fail();
    }
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
             operator*(in_stack_ffffffffffffff48);
    bVar1 = MoneyRange((CAmount *)in_stack_ffffffffffffff48);
    local_96 = 1;
    if (bVar1) {
      in_stack_ffffffffffffff98 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_50 + pCVar2->nValue);
      bVar1 = MoneyRange((CAmount *)in_stack_ffffffffffffff48);
      local_96 = bVar1 ^ 0xff;
    }
    if ((local_96 & 1) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xffffffffffffff97;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_RDI);
      std::operator+(__lhs,(char *)this_00);
      std::runtime_error::runtime_error(this_00,local_28);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_010141a4;
    }
    local_50 = pCVar2->nValue + local_50;
    __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
    operator++(in_stack_ffffffffffffff48);
  } while( true );
}

Assistant:

CAmount CTransaction::GetValueOut() const
{
    CAmount nValueOut = 0;
    for (const auto& tx_out : vout) {
        if (!MoneyRange(tx_out.nValue) || !MoneyRange(nValueOut + tx_out.nValue))
            throw std::runtime_error(std::string(__func__) + ": value out of range");
        nValueOut += tx_out.nValue;
    }
    assert(MoneyRange(nValueOut));
    return nValueOut;
}